

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_do(Curl_easy *data,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  *done = false;
  data_local._4_4_ = smtp_parse_custom_request(data);
  if ((((data_local._4_4_ == CURLE_OK) &&
       (data_local._4_4_ = smtp_regular_transfer(data,done), data != (Curl_easy *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
     ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    Curl_trc_smtp(data,"smtp_do() -> %d, done=%d",(ulong)data_local._4_4_,(ulong)(*done & 1));
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(data);
  if(result)
    return result;

  result = smtp_regular_transfer(data, done);
  CURL_TRC_SMTP(data, "smtp_do() -> %d, done=%d", result, *done);
  return result;
}